

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptcptransmitter.cpp
# Opt level: O0

bool __thiscall jrtplib::RTPTCPTransmitter::NewDataAvailable(RTPTCPTransmitter *this)

{
  bool local_19;
  bool v;
  RTPTCPTransmitter *this_local;
  
  if ((this->m_init & 1U) == 0) {
    this_local._7_1_ = false;
  }
  else {
    if ((this->m_created & 1U) == 0) {
      local_19 = false;
    }
    else {
      local_19 = std::__cxx11::
                 list<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>::empty
                           (&this->m_rawpacketlist);
      local_19 = !local_19;
    }
    this_local._7_1_ = local_19;
  }
  return this_local._7_1_;
}

Assistant:

bool RTPTCPTransmitter::NewDataAvailable()
{
	if (!m_init)
		return false;
	
	MAINMUTEX_LOCK
	
	bool v;
		
	if (!m_created)
		v = false;
	else
	{
		if (m_rawpacketlist.empty())
			v = false;
		else
			v = true;
	}
	
	MAINMUTEX_UNLOCK
	return v;
}